

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O2

void __thiscall soplex::LPColSetBase<double>::~LPColSetBase(LPColSetBase<double> *this)

{
  (this->super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__LPColSetBase_0053dcf8;
  DataArray<int>::~DataArray(&this->scaleExp);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->object);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->up);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&this->low);
  SVSetBase<double>::~SVSetBase(&this->super_SVSetBase<double>);
  return;
}

Assistant:

virtual ~LPColSetBase()
   {}